

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O3

optional<spv::Capability>
spvtools::opt::Handler_OpImageWrite_StorageImageWriteWithoutFormat(Instruction *instruction)

{
  IRContext *this;
  DefUseManager *this_00;
  uint32_t uVar1;
  Instruction *pIVar2;
  uint uVar3;
  
  if (instruction->opcode_ == OpImageWrite) {
    this = instruction->context_;
    if ((this->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this);
    }
    this_00 = (this->def_use_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    uVar1 = (instruction->has_result_id_ & 1) + 1;
    if (instruction->has_type_id_ == false) {
      uVar1 = (uint)instruction->has_result_id_;
    }
    uVar1 = Instruction::GetSingleWordOperand(instruction,uVar1);
    pIVar2 = analysis::DefUseManager::GetDef(this_00,uVar1);
    uVar1 = 0;
    if (pIVar2->has_type_id_ == true) {
      uVar1 = Instruction::GetSingleWordOperand(pIVar2,0);
    }
    pIVar2 = analysis::DefUseManager::GetDef(this_00,uVar1);
    uVar3 = (pIVar2->has_result_id_ & 1) + 1;
    if (pIVar2->has_type_id_ == false) {
      uVar3 = (uint)pIVar2->has_result_id_;
    }
    uVar1 = Instruction::GetSingleWordOperand(pIVar2,uVar3 + 6);
    return (_Optional_base<spv::Capability,_true,_true>)
           (_Optional_base<spv::Capability,_true,_true>)((ulong)(uVar1 == 0) << 0x20 | 0x38);
  }
  __assert_fail("instruction->opcode() == spv::Op::OpImageWrite && \"This handler only support OpImageWrite opcodes.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp"
                ,0x164,
                "std::optional<spv::Capability> spvtools::opt::Handler_OpImageWrite_StorageImageWriteWithoutFormat(const Instruction *)"
               );
}

Assistant:

static std::optional<spv::Capability>
Handler_OpImageWrite_StorageImageWriteWithoutFormat(
    const Instruction* instruction) {
  assert(instruction->opcode() == spv::Op::OpImageWrite &&
         "This handler only support OpImageWrite opcodes.");
  const auto* def_use_mgr = instruction->context()->get_def_use_mgr();

  const uint32_t image_index =
      instruction->GetSingleWordInOperand(kOpImageWriteImageIndex);
  const uint32_t type_index = def_use_mgr->GetDef(image_index)->type_id();

  // If the Image Format is Unknown, StorageImageWriteWithoutFormat is required.
  const Instruction* type = def_use_mgr->GetDef(type_index);
  const uint32_t format = type->GetSingleWordInOperand(kOpTypeImageFormatIndex);
  const bool is_unknown = spv::ImageFormat(format) == spv::ImageFormat::Unknown;
  return is_unknown
             ? std::optional(spv::Capability::StorageImageWriteWithoutFormat)
             : std::nullopt;
}